

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

AssertionResult * __thiscall
Catch::ResultBuilder::build(AssertionResult *__return_storage_ptr__,ResultBuilder *this)

{
  bool bVar1;
  string *this_00;
  string local_a0;
  undefined1 local_80 [64];
  OfType local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((this->m_data).resultType != Unknown) {
    AssertionResultData::AssertionResultData((AssertionResultData *)local_80,&this->m_data);
    if ((this->m_exprComponents).testFalse == true) {
      if (local_40 == Ok) {
        local_40 = ExpressionFailed;
      }
      else if (local_40 == ExpressionFailed) {
        local_40 = Ok;
      }
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)(local_80 + 0x20),(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    reconstructExpression_abi_cxx11_(&local_a0,this);
    std::__cxx11::string::operator=((string *)local_80,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    if ((this->m_exprComponents).testFalse == true) {
      bVar1 = std::operator==(&(this->m_exprComponents).op,"");
      if (bVar1) {
        std::operator+(&local_a0,"!",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                      );
        this_00 = &local_a0;
        std::__cxx11::string::operator=((string *)local_80,(string *)this_00);
      }
      else {
        std::operator+(&local_38,"!(",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                      );
        std::operator+(&local_a0,&local_38,")");
        std::__cxx11::string::operator=((string *)local_80,(string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        this_00 = &local_38;
      }
      std::__cxx11::string::~string((string *)this_00);
    }
    AssertionResult::AssertionResult
              (__return_storage_ptr__,&this->m_assertionInfo,(AssertionResultData *)local_80);
    AssertionResultData::~AssertionResultData((AssertionResultData *)local_80);
    return __return_storage_ptr__;
  }
  __assert_fail("m_data.resultType != ResultWas::Unknown",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/kasperisager[P]hemingway/vendor/catch.hpp"
                ,0x203f,"AssertionResult Catch::ResultBuilder::build() const");
}

Assistant:

AssertionResult ResultBuilder::build() const
    {
        assert( m_data.resultType != ResultWas::Unknown );

        AssertionResultData data = m_data;

        // Flip bool results if testFalse is set
        if( m_exprComponents.testFalse ) {
            if( data.resultType == ResultWas::Ok )
                data.resultType = ResultWas::ExpressionFailed;
            else if( data.resultType == ResultWas::ExpressionFailed )
                data.resultType = ResultWas::Ok;
        }

        data.message = m_stream.oss.str();
        data.reconstructedExpression = reconstructExpression();
        if( m_exprComponents.testFalse ) {
            if( m_exprComponents.op == "" )
                data.reconstructedExpression = "!" + data.reconstructedExpression;
            else
                data.reconstructedExpression = "!(" + data.reconstructedExpression + ")";
        }
        return AssertionResult( m_assertionInfo, data );
    }